

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit.c
# Opt level: O0

void envy_bios_print_bit(envy_bios *bios,FILE *out,uint mask)

{
  envy_bios_bit *peVar1;
  envy_bios_bit_entry *peVar2;
  envy_bios_bit_entry *entry_1;
  envy_bios_bit_entry *entry;
  int i;
  envy_bios_bit *bit;
  uint mask_local;
  FILE *out_local;
  envy_bios *bios_local;
  
  peVar1 = &bios->bit;
  if ((peVar1->offset != 0) && ((mask & 8) != 0)) {
    if ((bios->bit).valid == '\0') {
      fprintf((FILE *)out,"Failed to parse BIT table at 0x%04x version %d.%d\n\n",
              (ulong)peVar1->offset,(ulong)(uint)((int)(uint)(bios->bit).version >> 8),
              (ulong)((bios->bit).version & 0xff));
    }
    else {
      fprintf((FILE *)out,"BIT table at 0x%04x version %d.%d",(ulong)peVar1->offset,
              (ulong)(uint)((int)(uint)(bios->bit).version >> 8),(ulong)((bios->bit).version & 0xff)
             );
      fprintf((FILE *)out,"\n");
      envy_bios_dump_hex(bios,out,(uint)peVar1->offset,(uint)(bios->bit).hlen,mask);
      for (entry._4_4_ = 0; entry._4_4_ < (int)(uint)(bios->bit).entriesnum;
          entry._4_4_ = entry._4_4_ + 1) {
        peVar2 = (bios->bit).entries + entry._4_4_;
        fprintf((FILE *)out,"BIT table \'%c\' version %d at 0x%04x length 0x%04x\n",
                (ulong)peVar2->type,(ulong)peVar2->version,(ulong)peVar2->t_offset,
                (ulong)peVar2->t_len);
        envy_bios_dump_hex(bios,out,(uint)peVar2->offset,(uint)(bios->bit).rlen,mask);
      }
      fprintf((FILE *)out,"\n");
      for (entry._4_4_ = 0; entry._4_4_ < (int)(uint)(bios->bit).entriesnum;
          entry._4_4_ = entry._4_4_ + 1) {
        peVar2 = (bios->bit).entries;
        if (peVar2[entry._4_4_].is_unk != '\0') {
          fprintf((FILE *)out,"Unknown BIT table \'%c\' version %d\n",
                  (ulong)peVar2[entry._4_4_].type,(ulong)peVar2[entry._4_4_].version);
          envy_bios_dump_hex(bios,out,(uint)peVar2[entry._4_4_].t_offset,
                             (uint)peVar2[entry._4_4_].t_len,mask);
          fprintf((FILE *)out,"\n");
        }
      }
    }
  }
  return;
}

Assistant:

void envy_bios_print_bit (struct envy_bios *bios, FILE *out, unsigned mask) {
	struct envy_bios_bit *bit = &bios->bit;
	if (!bit->offset || !(mask & ENVY_BIOS_PRINT_BMP_BIT))
		return;
	if (!bit->valid) {
		fprintf(out, "Failed to parse BIT table at 0x%04x version %d.%d\n\n", bit->offset, bit->version >> 8, bit->version & 0xff);
		return;
	}
	fprintf(out, "BIT table at 0x%04x version %d.%d", bit->offset, bit->version >> 8, bit->version & 0xff);
	fprintf(out, "\n");
	envy_bios_dump_hex(bios, out, bit->offset, bit->hlen, mask);
	int i;
	for (i = 0; i < bit->entriesnum; i++) {
		struct envy_bios_bit_entry *entry = &bit->entries[i];
		fprintf (out, "BIT table '%c' version %d at 0x%04x length 0x%04x\n", entry->type, entry->version, entry->t_offset, entry->t_len);
		envy_bios_dump_hex(bios, out, entry->offset, bit->rlen, mask);
	}
	fprintf(out, "\n");
	for (i = 0; i < bit->entriesnum; i++) {
		struct envy_bios_bit_entry *entry = &bit->entries[i];
		if (entry->is_unk) {
			fprintf (out, "Unknown BIT table '%c' version %d\n", entry->type, entry->version);
			envy_bios_dump_hex(bios, out, entry->t_offset, entry->t_len, mask);
			fprintf(out, "\n");
		}
	}
}